

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxeffectslot.cpp
# Opt level: O2

void alGenAuxiliaryEffectSlots(ALsizei n,ALuint *effectslots)

{
  vector<EffectSlotSubList> *this;
  uint uVar1;
  ContextRef CVar2;
  pointer pEVar3;
  ALeffectslot *pAVar4;
  ALCcontext *context_00;
  ALCcontext *context_01;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  ALCcontext *pAVar8;
  ContextRef context;
  vector<ALuint> ids;
  unique_lock<std::mutex> slotlock;
  
  GetContextRef();
  if (context.mPtr == (ALCcontext *)0x0) goto LAB_0011559c;
  if (n < 0) {
    ALCcontext::setError(context.mPtr,0xa003,"Generating %d effect slots",(ulong)(uint)n);
    goto LAB_0011559c;
  }
  if (n == 0) goto LAB_0011559c;
  std::unique_lock<std::mutex>::unique_lock(&slotlock,&(context.mPtr)->mEffectSlotLock);
  CVar2 = context;
  uVar1 = (((context.mPtr)->mDevice).mPtr)->AuxiliaryEffectSlotMax;
  if (uVar1 - (context.mPtr)->mNumEffectSlots < (uint)n) {
    ALCcontext::setError
              (context.mPtr,0xa005,"Exceeding %u effect slot limit (%u + %d)",(ulong)uVar1,
               (ulong)(context.mPtr)->mNumEffectSlots,(ulong)(uint)n);
  }
  else {
    this = &(context.mPtr)->mEffectSlotList;
    lVar7 = 0;
    context_00 = (ALCcontext *)0x3333333333333333;
    for (pEVar3 = ((context.mPtr)->mEffectSlotList).
                  super__Vector_base<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pEVar3 != ((context.mPtr)->mEffectSlotList).
                  super__Vector_base<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pEVar3 = pEVar3 + 1) {
      uVar6 = pEVar3->FreeMask - (pEVar3->FreeMask >> 1 & 0x5555555555555555);
      uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
      lVar7 = lVar7 + (((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
    }
    context_01 = (ALCcontext *)(ulong)(uint)n;
    pAVar8 = (ALCcontext *)(lVar7 + -0x40);
    do {
      pAVar8 = (ALCcontext *)((pAVar8->mSourceLock).super___mutex_base._M_mutex.__size + 0x18);
      if (context_01 <= pAVar8) {
        if (n != 1) {
          ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::reserve
                    (&ids,(size_type)context_01);
          goto LAB_00115527;
        }
        pAVar4 = anon_unknown.dwarf_91b2::AllocEffectSlot
                           ((anon_unknown_dwarf_91b2 *)context.mPtr,context_00);
        if (pAVar4 != (ALeffectslot *)0x0) {
          *effectslots = pAVar4->id;
        }
        goto LAB_00115592;
      }
      if (0x1ffffff0 <
          (ulong)((long)((CVar2.mPtr)->mEffectSlotList).
                        super__Vector_base<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)((CVar2.mPtr)->mEffectSlotList).
                       super__Vector_base<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>
                       ._M_impl.super__Vector_impl_data._M_start)) goto LAB_001154a9;
      std::vector<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>::emplace_back<>(this);
      pEVar3 = ((CVar2.mPtr)->mEffectSlotList).
               super__Vector_base<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pEVar3[-1].FreeMask = 0xffffffffffffffff;
      context_00 = (ALCcontext *)0x7a00;
      pAVar4 = (ALeffectslot *)al_calloc(8,0x7a00);
      pEVar3[-1].EffectSlots = pAVar4;
    } while (pAVar4 != (ALeffectslot *)0x0);
    std::vector<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>::pop_back(this);
LAB_001154a9:
    pcVar5 = "s";
    if (n == 1) {
      pcVar5 = "";
    }
    ALCcontext::setError
              (context.mPtr,0xa005,"Failed to allocate %d effectslot%s",(ulong)(uint)n,pcVar5);
  }
  goto LAB_00115592;
  while( true ) {
    context_01 = (ALCcontext *)&pAVar4->id;
    std::vector<unsigned_int,al::allocator<unsigned_int,4ul>>::emplace_back<unsigned_int&>
              ((vector<unsigned_int,al::allocator<unsigned_int,4ul>> *)&ids,(uint *)context_01);
    n = n + -1;
    if (n == 0) break;
LAB_00115527:
    pAVar4 = anon_unknown.dwarf_91b2::AllocEffectSlot
                       ((anon_unknown_dwarf_91b2 *)context.mPtr,context_01);
    if (pAVar4 == (ALeffectslot *)0x0) {
      std::unique_lock<std::mutex>::unlock(&slotlock);
      alDeleteAuxiliaryEffectSlots
                ((ALsizei)((ulong)((long)ids.
                                         super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)ids.
                                        super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2),
                 ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
                 super__Vector_impl_data._M_start);
      goto LAB_0011558d;
    }
  }
  if ((long)ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    memmove(effectslots,
            ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
            super__Vector_impl_data._M_start,
            (long)ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
                  super__Vector_impl_data._M_start);
  }
LAB_0011558d:
  std::_Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::~_Vector_base
            (&ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>);
LAB_00115592:
  std::unique_lock<std::mutex>::~unique_lock(&slotlock);
LAB_0011559c:
  al::intrusive_ptr<ALCcontext>::~intrusive_ptr(&context);
  return;
}

Assistant:

AL_API void AL_APIENTRY alGenAuxiliaryEffectSlots(ALsizei n, ALuint *effectslots)
START_API_FUNC
{
    ContextRef context{GetContextRef()};
    if UNLIKELY(!context) return;

    if UNLIKELY(n < 0)
        context->setError(AL_INVALID_VALUE, "Generating %d effect slots", n);
    if UNLIKELY(n <= 0) return;

    std::unique_lock<std::mutex> slotlock{context->mEffectSlotLock};
    ALCdevice *device{context->mDevice.get()};
    if(static_cast<ALuint>(n) > device->AuxiliaryEffectSlotMax-context->mNumEffectSlots)
    {
        context->setError(AL_OUT_OF_MEMORY, "Exceeding %u effect slot limit (%u + %d)",
            device->AuxiliaryEffectSlotMax, context->mNumEffectSlots, n);
        return;
    }
    if(!EnsureEffectSlots(context.get(), static_cast<ALuint>(n)))
    {
        context->setError(AL_OUT_OF_MEMORY, "Failed to allocate %d effectslot%s", n,
            (n==1) ? "" : "s");
        return;
    }

    if(n == 1)
    {
        ALeffectslot *slot{AllocEffectSlot(context.get())};
        if(!slot) return;
        effectslots[0] = slot->id;
    }
    else
    {
        al::vector<ALuint> ids;
        ALsizei count{n};
        ids.reserve(static_cast<ALuint>(count));
        do {
            ALeffectslot *slot{AllocEffectSlot(context.get())};
            if(!slot)
            {
                slotlock.unlock();
                alDeleteAuxiliaryEffectSlots(static_cast<ALsizei>(ids.size()), ids.data());
                return;
            }
            ids.emplace_back(slot->id);
        } while(--count);
        std::copy(ids.cbegin(), ids.cend(), effectslots);
    }
}